

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamSummary.h
# Opt level: O2

void __thiscall
StreamSummary<4U>::Add_Bucket(StreamSummary<4U> *this,StreamBucket *prev,StreamCounter *counter)

{
  int iVar1;
  StreamBucket *pSVar2;
  StreamCounter *pSVar3;
  StreamBucket *pSVar4;
  
  pSVar2 = (StreamBucket *)(prev->super_Node<int>).next;
  if (pSVar2 == (StreamBucket *)0x0) {
    pSVar4 = (StreamBucket *)operator_new(0x20);
    (pSVar4->super_Node<int>).ID = (prev->super_Node<int>).ID + 1;
    (pSVar4->super_Node<int>).next = (Node<int> *)0x0;
    pSVar4->child = (StreamCounter *)0x0;
    (prev->super_Node<int>).next = (Node<int> *)pSVar4;
    (pSVar4->super_Node<int>).prev = &prev->super_Node<int>;
  }
  else {
    iVar1 = (prev->super_Node<int>).ID;
    pSVar4 = pSVar2;
    if (1 < (pSVar2->super_Node<int>).ID - iVar1) {
      pSVar4 = (StreamBucket *)operator_new(0x20);
      (pSVar4->super_Node<int>).ID = iVar1 + 1;
      pSVar4->child = (StreamCounter *)0x0;
      (prev->super_Node<int>).next = (Node<int> *)pSVar4;
      (pSVar4->super_Node<int>).prev = &prev->super_Node<int>;
      (pSVar4->super_Node<int>).next = (Node<int> *)pSVar2;
      (pSVar2->super_Node<int>).prev = (Node<int> *)pSVar4;
    }
  }
  (counter->super_Node<Data<4U>_>).prev = (Node<Data<4U>_> *)0x0;
  counter->parent = pSVar4;
  pSVar3 = pSVar4->child;
  (counter->super_Node<Data<4U>_>).next = &pSVar3->super_Node<Data<4U>_>;
  if (pSVar3 != (StreamCounter *)0x0) {
    (pSVar3->super_Node<Data<4U>_>).prev = &counter->super_Node<Data<4U>_>;
  }
  pSVar4->child = counter;
  return;
}

Assistant:

void Add_Bucket(StreamBucket* prev, StreamCounter* counter) {
		if (prev->next == NULL) {
			prev->Connect(prev, new StreamBucket(prev->ID + 1));
		}
		else if (prev->next->ID - prev->ID > 1) {
			StreamBucket* temp = (StreamBucket*)prev->next;
			StreamBucket* add = new StreamBucket(prev->ID + 1);
			prev->Connect(prev, add);
			add->Connect(add, temp);
		}

		Counter2Bucket(counter, (StreamBucket*)prev->next);
	}